

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::iterate
          (ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this)

{
  ostringstream *this_00;
  GetConstantValueFunc p_Var1;
  TestLog *log;
  ulong uVar2;
  int iVar3;
  ShaderExecutor *pSVar4;
  ulong uVar5;
  TestError *this_01;
  ShaderType shaderType;
  Vector<int,_3> result;
  ScopedLogSection section;
  char *shaderTypeName;
  void *outputs;
  Vector<int,_3> reference;
  allocator<char> local_3a1;
  string local_3a0;
  undefined8 local_380;
  int local_378;
  ScopedLogSection local_370;
  char *local_368;
  string *local_360;
  string *local_358;
  string *local_350;
  pointer local_348;
  int local_340;
  undefined1 local_33c [12];
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  p_Var1 = this->m_getValue;
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (*p_Var1)((Functions *)local_33c);
  shaderType = SHADERTYPE_VERTEX;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_350 = &this->m_varName;
  local_358 = &this->m_requiredExt;
  this_00 = (ostringstream *)(local_330 + 8);
  do {
    local_368 = glu::getShaderTypeName(shaderType);
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,local_368,(allocator<char> *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,local_368,&local_3a1);
    tcu::ScopedLogSection::ScopedLogSection(&local_370,log,(string *)local_330,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._0_8_ != local_320) {
      operator_delete((void *)local_330._0_8_,local_320[0]._M_allocated_capacity + 1);
    }
    local_380 = (glActiveShaderProgramFunc)local_33c._0_8_;
    local_378 = local_33c._8_4_;
    pSVar4 = createGetConstantExecutor
                       (((this->super_TestCase).m_context)->m_renderCtx,shaderType,TYPE_INT_VEC3,
                        local_350,local_358);
    local_3a0._M_string_length._0_4_ = -1;
    local_3a0._M_dataplus._M_p = &DAT_ffffffffffffffff;
    local_360 = &local_3a0;
    iVar3 = (*pSVar4->_vptr_ShaderExecutor[2])(pSVar4);
    if ((char)iVar3 == '\0') {
      (*pSVar4->_vptr_ShaderExecutor[3])
                (pSVar4,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                 ,0xe8);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pSVar4->_vptr_ShaderExecutor[5])(pSVar4);
    (*pSVar4->_vptr_ShaderExecutor[6])(pSVar4,1,0,&local_360);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_340 = (int)local_3a0._M_string_length;
    local_348 = local_3a0._M_dataplus._M_p;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->m_varName)._M_dataplus._M_p,
               (this->m_varName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_3> *)&local_348);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((int)local_3a0._M_dataplus._M_p == (int)local_380) {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 2) {
          uVar5 = 2;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (*(int *)((long)&local_3a0._M_dataplus._M_p + uVar5 * 4 + 4) ==
               *(int *)((long)&local_380 + uVar5 * 4 + 4));
      if (uVar5 < 2) goto LAB_0166ffb5;
    }
    else {
LAB_0166ffb5:
      local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ERROR: Expected ",0x10)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(this->m_varName)._M_dataplus._M_p,
                 (this->m_varName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
      tcu::operator<<((ostream *)this_00,(Vector<int,_3> *)&local_380);
      local_1b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Test shader:",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_2b8);
      (*pSVar4->_vptr_ShaderExecutor[3])
                (pSVar4,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid builtin constant value");
    }
    (*pSVar4->_vptr_ShaderExecutor[1])(pSVar4);
    tcu::TestLog::endSection(local_370.m_log);
    shaderType = shaderType + SHADERTYPE_FRAGMENT;
    if (shaderType == SHADERTYPE_LAST) {
      return STOP;
    }
  } while( true );
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}